

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<capnp::_::RpcSystemBase::Impl> __thiscall
kj::
heap<capnp::_::RpcSystemBase::Impl,capnp::_::VatNetworkBase&,capnp::_::BootstrapFactoryBase&,kj::Maybe<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::Client>>
          (kj *this,VatNetworkBase *params,BootstrapFactoryBase *params_1,
          Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
          *params_2)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  Impl *pIVar3;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Own<capnp::_::RpcSystemBase::Impl> OVar4;
  undefined1 local_50 [32];
  
  pIVar3 = (Impl *)operator_new(0xd0);
  local_50[0] = (params_2->ptr).isSet;
  if (local_50[0] == true) {
    p_Var1 = (params_2->ptr).field_1.value._vptr_Client[-3];
    local_50._16_8_ = *(undefined8 *)(p_Var1 + 8 + (long)&(params_2->ptr).isSet);
    local_50._24_8_ = *(undefined8 *)(p_Var1 + 0x10 + (long)&(params_2->ptr).isSet);
    *(undefined8 *)(p_Var1 + 0x10 + (long)&(params_2->ptr).isSet) = 0;
    local_50._8_8_ =
         &capnp::
          RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::
          Client::typeinfo;
  }
  capnp::_::RpcSystemBase::Impl::Impl
            (pIVar3,params,params_1,
             (Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
              *)local_50);
  uVar2 = local_50._24_8_;
  *(undefined8 **)this = &_::HeapDisposer<capnp::_::RpcSystemBase::Impl>::instance;
  *(Impl **)(this + 8) = pIVar3;
  pIVar3 = extraout_RDX;
  if ((local_50[0] == true) && ((long *)local_50._24_8_ != (long *)0x0)) {
    local_50._24_8_ = 0;
    (*(code *)**(undefined8 **)local_50._16_8_)
              (local_50._16_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
    pIVar3 = extraout_RDX_00;
  }
  OVar4.ptr = pIVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}